

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int lj_cf_io_type(lua_State *L)

{
  long lVar1;
  TValue *pTVar2;
  size_t in_RDI;
  char *unaff_retaddr;
  cTValue *o;
  int in_stack_ffffffffffffffec;
  lua_State *in_stack_fffffffffffffff0;
  
  pTVar2 = lj_lib_checkany(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  if (((pTVar2->field_2).it == 0xfffffff3) && (*(char *)((ulong)(pTVar2->u32).lo + 6) == '\x01')) {
    if (*(long *)((ulong)(pTVar2->u32).lo + 0x18) == 0) {
      lua_pushlstring((lua_State *)&o->field_2,unaff_retaddr,in_RDI);
    }
    else {
      lua_pushlstring((lua_State *)&o->field_2,unaff_retaddr,in_RDI);
    }
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x18);
    *(long *)(in_RDI + 0x18) = lVar1 + 8;
    *(undefined4 *)(lVar1 + 4) = 0xffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(io_type)
{
  cTValue *o = lj_lib_checkany(L, 1);
  if (!(tvisudata(o) && udataV(o)->udtype == UDTYPE_IO_FILE))
    setnilV(L->top++);
  else if (((IOFileUD *)uddata(udataV(o)))->fp != NULL)
    lua_pushliteral(L, "file");
  else
    lua_pushliteral(L, "closed file");
  return 1;
}